

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::rescale_variable_scores(Internal *this)

{
  double dVar1;
  pointer pdVar2;
  int iVar3;
  long count;
  int iVar4;
  bool bVar5;
  double dVar6;
  
  count = (this->stats).rescored + 1;
  (this->stats).rescored = count;
  dVar6 = this->score_inc;
  iVar3 = *(this->vars).n;
  if (iVar3 != 0) {
    iVar4 = 1;
    do {
      dVar1 = (this->stab).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if (dVar1 <= dVar6) {
        dVar1 = dVar6;
      }
      dVar6 = dVar1;
      bVar5 = iVar4 != iVar3;
      iVar4 = iVar4 + 1;
    } while (bVar5);
  }
  if (this->internal != (Internal *)0x0) {
    phase(this->internal,"rescore",count,"rescoring %d variable scores by 1/%g",dVar6,
          (ulong)(uint)this->max_var);
    iVar3 = *(this->vars).n;
  }
  if (iVar3 != 0) {
    pdVar2 = (this->stab).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 1;
    do {
      pdVar2[iVar4] = pdVar2[iVar4] * (1.0 / dVar6);
      bVar5 = iVar4 != iVar3;
      iVar4 = iVar4 + 1;
    } while (bVar5);
  }
  this->score_inc = (1.0 / dVar6) * this->score_inc;
  if (this->internal == (Internal *)0x0) {
    return;
  }
  phase(this->internal,"rescore",(this->stats).rescored,"new score increment %g after %ld conflicts"
        ,(this->stats).conflicts);
  return;
}

Assistant:

void Internal::rescale_variable_scores () {
  stats.rescored++;
  double divider = score_inc;
  for (auto idx : vars) {
    const double tmp = stab[idx];
    if (tmp > divider)
      divider = tmp;
  }
  PHASE ("rescore", stats.rescored, "rescoring %d variable scores by 1/%g",
         max_var, divider);
  assert (divider > 0);
  double factor = 1.0 / divider;
  for (auto idx : vars)
    stab[idx] *= factor;
  score_inc *= factor;
  PHASE ("rescore", stats.rescored,
         "new score increment %g after %" PRId64 " conflicts", score_inc,
         stats.conflicts);
}